

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackIFWInstaller.cxx
# Opt level: O2

void __thiscall cmCPackIFWInstaller::GenerateInstallerFile(cmCPackIFWInstaller *this)

{
  string *__lhs;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  pointer ppcVar1;
  cmCPackIFWGenerator *pcVar2;
  cmCPackLog *this_01;
  bool bVar3;
  ostream *poVar4;
  pointer ppcVar5;
  long lVar6;
  ulong r;
  string path_7;
  string path;
  cmXMLWriter xout;
  string name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  resources;
  cmGeneratedFileStream fout;
  
  __lhs = &this->Directory;
  if (((this->Directory)._M_string_length == 0) &&
     ((this->super_cmCPackIFWCommon).Generator != (cmCPackIFWGenerator *)0x0)) {
    std::__cxx11::string::_M_assign((string *)__lhs);
  }
  std::operator+(&name,__lhs,"/config/config.xml");
  cmGeneratedFileStream::cmGeneratedFileStream(&fout,&name,false,None);
  std::__cxx11::string::~string((string *)&name);
  cmXMLWriter::cmXMLWriter(&xout,(ostream *)&fout,0);
  cmXMLWriter::StartDocument(&xout,"UTF-8");
  cmCPackIFWCommon::WriteGeneratedByToStrim(&this->super_cmCPackIFWCommon,&xout);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&name,"Installer",(allocator<char> *)&path);
  cmXMLWriter::StartElement(&xout,&name);
  std::__cxx11::string::~string((string *)&name);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&name,"Name",(allocator<char> *)&path);
  cmXMLWriter::Element<std::__cxx11::string>(&xout,&name,&this->Name);
  std::__cxx11::string::~string((string *)&name);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&name,"Version",(allocator<char> *)&path);
  cmXMLWriter::Element<std::__cxx11::string>(&xout,&name,&this->Version);
  std::__cxx11::string::~string((string *)&name);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&name,"Title",(allocator<char> *)&path);
  cmXMLWriter::Element<std::__cxx11::string>(&xout,&name,&this->Title);
  std::__cxx11::string::~string((string *)&name);
  if ((this->Publisher)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&name,"Publisher",(allocator<char> *)&path);
    cmXMLWriter::Element<std::__cxx11::string>(&xout,&name,&this->Publisher);
    std::__cxx11::string::~string((string *)&name);
  }
  if ((this->ProductUrl)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&name,"ProductUrl",(allocator<char> *)&path);
    cmXMLWriter::Element<std::__cxx11::string>(&xout,&name,&this->ProductUrl);
    std::__cxx11::string::~string((string *)&name);
  }
  if ((this->InstallerApplicationIcon)._M_string_length != 0) {
    cmsys::SystemTools::GetFilenameName(&name,&this->InstallerApplicationIcon);
    std::operator+(&path_7,__lhs,"/config/");
    std::operator+(&path,&path_7,&name);
    std::__cxx11::string::~string((string *)&path_7);
    cmsys::SystemTools::GetFilenameWithoutExtension(&path_7,&name);
    std::__cxx11::string::operator=((string *)&name,(string *)&path_7);
    std::__cxx11::string::~string((string *)&path_7);
    cmsys::SystemTools::CopyFileIfDifferent(&this->InstallerApplicationIcon,&path);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&path_7,"InstallerApplicationIcon",(allocator<char> *)&local_2b8);
    cmXMLWriter::Element<std::__cxx11::string>(&xout,&path_7,&name);
    std::__cxx11::string::~string((string *)&path_7);
    std::__cxx11::string::~string((string *)&path);
    std::__cxx11::string::~string((string *)&name);
  }
  if ((this->InstallerWindowIcon)._M_string_length != 0) {
    cmsys::SystemTools::GetFilenameName(&name,&this->InstallerWindowIcon);
    std::operator+(&path_7,__lhs,"/config/");
    std::operator+(&path,&path_7,&name);
    std::__cxx11::string::~string((string *)&path_7);
    cmsys::SystemTools::CopyFileIfDifferent(&this->InstallerWindowIcon,&path);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&path_7,"InstallerWindowIcon",(allocator<char> *)&local_2b8);
    cmXMLWriter::Element<std::__cxx11::string>(&xout,&path_7,&name);
    std::__cxx11::string::~string((string *)&path_7);
    std::__cxx11::string::~string((string *)&path);
    std::__cxx11::string::~string((string *)&name);
  }
  if ((this->Logo)._M_string_length != 0) {
    cmsys::SystemTools::GetFilenameName(&name,&this->Logo);
    std::operator+(&path_7,__lhs,"/config/");
    std::operator+(&path,&path_7,&name);
    std::__cxx11::string::~string((string *)&path_7);
    cmsys::SystemTools::CopyFileIfDifferent(&this->Logo,&path);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&path_7,"Logo",(allocator<char> *)&local_2b8);
    cmXMLWriter::Element<std::__cxx11::string>(&xout,&path_7,&name);
    std::__cxx11::string::~string((string *)&path_7);
    std::__cxx11::string::~string((string *)&path);
    std::__cxx11::string::~string((string *)&name);
  }
  if ((this->Banner)._M_string_length != 0) {
    cmsys::SystemTools::GetFilenameName(&name,&this->Banner);
    std::operator+(&path_7,__lhs,"/config/");
    std::operator+(&path,&path_7,&name);
    std::__cxx11::string::~string((string *)&path_7);
    cmsys::SystemTools::CopyFileIfDifferent(&this->Banner,&path);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&path_7,"Banner",(allocator<char> *)&local_2b8);
    cmXMLWriter::Element<std::__cxx11::string>(&xout,&path_7,&name);
    std::__cxx11::string::~string((string *)&path_7);
    std::__cxx11::string::~string((string *)&path);
    std::__cxx11::string::~string((string *)&name);
  }
  if ((this->Watermark)._M_string_length != 0) {
    cmsys::SystemTools::GetFilenameName(&name,&this->Watermark);
    std::operator+(&path_7,__lhs,"/config/");
    std::operator+(&path,&path_7,&name);
    std::__cxx11::string::~string((string *)&path_7);
    cmsys::SystemTools::CopyFileIfDifferent(&this->Watermark,&path);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&path_7,"Watermark",(allocator<char> *)&local_2b8);
    cmXMLWriter::Element<std::__cxx11::string>(&xout,&path_7,&name);
    std::__cxx11::string::~string((string *)&path_7);
    std::__cxx11::string::~string((string *)&path);
    std::__cxx11::string::~string((string *)&name);
  }
  if ((this->Background)._M_string_length != 0) {
    cmsys::SystemTools::GetFilenameName(&name,&this->Background);
    std::operator+(&path_7,__lhs,"/config/");
    std::operator+(&path,&path_7,&name);
    std::__cxx11::string::~string((string *)&path_7);
    cmsys::SystemTools::CopyFileIfDifferent(&this->Background,&path);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&path_7,"Background",(allocator<char> *)&local_2b8);
    cmXMLWriter::Element<std::__cxx11::string>(&xout,&path_7,&name);
    std::__cxx11::string::~string((string *)&path_7);
    std::__cxx11::string::~string((string *)&path);
    std::__cxx11::string::~string((string *)&name);
  }
  if ((this->WizardStyle)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&name,"WizardStyle",(allocator<char> *)&path);
    cmXMLWriter::Element<std::__cxx11::string>(&xout,&name,&this->WizardStyle);
    std::__cxx11::string::~string((string *)&name);
  }
  if ((this->WizardDefaultWidth)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&name,"WizardDefaultWidth",(allocator<char> *)&path);
    cmXMLWriter::Element<std::__cxx11::string>(&xout,&name,&this->WizardDefaultWidth);
    std::__cxx11::string::~string((string *)&name);
  }
  if ((this->WizardDefaultHeight)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&name,"WizardDefaultHeight",(allocator<char> *)&path);
    cmXMLWriter::Element<std::__cxx11::string>(&xout,&name,&this->WizardDefaultHeight);
    std::__cxx11::string::~string((string *)&name);
  }
  if ((this->TitleColor)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&name,"TitleColor",(allocator<char> *)&path);
    cmXMLWriter::Element<std::__cxx11::string>(&xout,&name,&this->TitleColor);
    std::__cxx11::string::~string((string *)&name);
  }
  bVar3 = cmCPackIFWCommon::IsVersionLess(&this->super_cmCPackIFWCommon,"2.0");
  if (!bVar3) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&name,"StartMenuDir",(allocator<char> *)&path);
    cmXMLWriter::Element<std::__cxx11::string>(&xout,&name,&this->StartMenuDir);
    std::__cxx11::string::~string((string *)&name);
  }
  if ((this->TargetDir)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&name,"TargetDir",(allocator<char> *)&path);
    cmXMLWriter::Element<std::__cxx11::string>(&xout,&name,&this->TargetDir);
    std::__cxx11::string::~string((string *)&name);
  }
  if ((this->AdminTargetDir)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&name,"AdminTargetDir",(allocator<char> *)&path);
    cmXMLWriter::Element<std::__cxx11::string>(&xout,&name,&this->AdminTargetDir);
    std::__cxx11::string::~string((string *)&name);
  }
  if ((this->RemoteRepositories).
      super__Vector_base<cmCPackIFWRepository_*,_std::allocator<cmCPackIFWRepository_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (this->RemoteRepositories).
      super__Vector_base<cmCPackIFWRepository_*,_std::allocator<cmCPackIFWRepository_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&name,"RemoteRepositories",(allocator<char> *)&path);
    cmXMLWriter::StartElement(&xout,&name);
    std::__cxx11::string::~string((string *)&name);
    ppcVar1 = (this->RemoteRepositories).
              super__Vector_base<cmCPackIFWRepository_*,_std::allocator<cmCPackIFWRepository_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    for (ppcVar5 = (this->RemoteRepositories).
                   super__Vector_base<cmCPackIFWRepository_*,_std::allocator<cmCPackIFWRepository_*>_>
                   ._M_impl.super__Vector_impl_data._M_start; ppcVar5 != ppcVar1;
        ppcVar5 = ppcVar5 + 1) {
      cmCPackIFWRepository::WriteRepositoryConfig(*ppcVar5,&xout);
    }
    cmXMLWriter::EndElement(&xout);
  }
  bVar3 = cmCPackIFWCommon::IsVersionLess(&this->super_cmCPackIFWCommon,"2.0");
  if ((!bVar3) && ((this->MaintenanceToolName)._M_string_length != 0)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&name,"MaintenanceToolName",(allocator<char> *)&path);
    cmXMLWriter::Element<std::__cxx11::string>(&xout,&name,&this->MaintenanceToolName);
    std::__cxx11::string::~string((string *)&name);
  }
  bVar3 = cmCPackIFWCommon::IsVersionLess(&this->super_cmCPackIFWCommon,"2.0");
  if ((!bVar3) && ((this->MaintenanceToolIniFile)._M_string_length != 0)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&name,"MaintenanceToolIniFile",(allocator<char> *)&path);
    cmXMLWriter::Element<std::__cxx11::string>(&xout,&name,&this->MaintenanceToolIniFile);
    std::__cxx11::string::~string((string *)&name);
  }
  if ((this->RemoveTargetDir)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&name,"RemoveTargetDir",(allocator<char> *)&path);
    cmXMLWriter::Element<std::__cxx11::string>(&xout,&name,&this->RemoveTargetDir);
    std::__cxx11::string::~string((string *)&name);
  }
  bVar3 = cmCPackIFWCommon::IsVersionLess(&this->super_cmCPackIFWCommon,"2.0");
  if (bVar3) {
    cmXMLWriter::Comment(&xout,"CPack IFW default policy for QtIFW less 2.0");
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&name,"AllowNonAsciiCharacters",(allocator<char> *)&path);
    cmXMLWriter::Element<char[5]>(&xout,&name,(char (*) [5])0x461aae);
    std::__cxx11::string::~string((string *)&name);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&name,"AllowSpaceInPath",(allocator<char> *)&path);
    cmXMLWriter::Element<char[5]>(&xout,&name,(char (*) [5])0x461aae);
  }
  else {
    if ((this->AllowNonAsciiCharacters)._M_string_length != 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&name,"AllowNonAsciiCharacters",(allocator<char> *)&path);
      cmXMLWriter::Element<std::__cxx11::string>(&xout,&name,&this->AllowNonAsciiCharacters);
      std::__cxx11::string::~string((string *)&name);
    }
    if ((this->AllowSpaceInPath)._M_string_length == 0) goto LAB_00158fb3;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&name,"AllowSpaceInPath",(allocator<char> *)&path);
    cmXMLWriter::Element<std::__cxx11::string>(&xout,&name,&this->AllowSpaceInPath);
  }
  std::__cxx11::string::~string((string *)&name);
LAB_00158fb3:
  bVar3 = cmCPackIFWCommon::IsVersionLess(&this->super_cmCPackIFWCommon,"2.0");
  if ((!bVar3) && ((this->ControlScript)._M_string_length != 0)) {
    cmsys::SystemTools::GetFilenameName(&name,&this->ControlScript);
    std::operator+(&path_7,__lhs,"/config/");
    std::operator+(&path,&path_7,&name);
    std::__cxx11::string::~string((string *)&path_7);
    cmsys::SystemTools::CopyFileIfDifferent(&this->ControlScript,&path);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&path_7,"ControlScript",(allocator<char> *)&local_2b8);
    cmXMLWriter::Element<std::__cxx11::string>(&xout,&path_7,&name);
    std::__cxx11::string::~string((string *)&path_7);
    std::__cxx11::string::~string((string *)&path);
    std::__cxx11::string::~string((string *)&name);
  }
  if ((this->Resources).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (this->Resources).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    resources.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    resources.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    resources.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    cmCPackIFWResourcesParser::cmCPackIFWResourcesParser((cmCPackIFWResourcesParser *)&path,this);
    this_00 = &this->Resources;
    lVar6 = 0;
    for (r = 0; r < (ulong)((long)(this->Resources).
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(this->Resources).
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start >> 5); r = r + 1) {
      bVar3 = cmCPackIFWResourcesParser::ParseResource((cmCPackIFWResourcesParser *)&path,r);
      if (bVar3) {
        cmsys::SystemTools::GetFilenameName
                  (&name,(string *)
                         ((long)&(((this_00->
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   )._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                         lVar6));
        std::operator+(&local_2b8,__lhs,"/resources/");
        std::operator+(&path_7,&local_2b8,&name);
        std::__cxx11::string::~string((string *)&local_2b8);
        cmsys::SystemTools::CopyFileIfDifferent
                  ((string *)
                   ((long)&(((this_00->
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar6)
                   ,&path_7);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&resources,
                   &name);
        std::__cxx11::string::~string((string *)&path_7);
        std::__cxx11::string::~string((string *)&name);
      }
      else {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&name);
        poVar4 = std::operator<<((ostream *)&name,"Can\'t copy resources from \"");
        poVar4 = std::operator<<(poVar4,(string *)
                                        ((long)&(((this_00->
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start)->
                                                _M_dataplus)._M_p + lVar6));
        poVar4 = std::operator<<(poVar4,"\". Resource will be skipped.");
        std::endl<char,std::char_traits<char>>(poVar4);
        pcVar2 = (this->super_cmCPackIFWCommon).Generator;
        if (pcVar2 != (cmCPackIFWGenerator *)0x0) {
          this_01 = (pcVar2->super_cmCPackGenerator).Logger;
          std::__cxx11::stringbuf::str();
          cmCPackLog::Log(this_01,8,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CPack/IFW/cmCPackIFWInstaller.cxx"
                          ,0x1da,path_7._M_dataplus._M_p);
          std::__cxx11::string::~string((string *)&path_7);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&name);
      }
      lVar6 = lVar6 + 0x20;
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=(this_00,&resources);
    cmCPackIFWResourcesParser::~cmCPackIFWResourcesParser((cmCPackIFWResourcesParser *)&path);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&resources);
  }
  cmXMLWriter::EndElement(&xout);
  cmXMLWriter::EndDocument(&xout);
  cmXMLWriter::~cmXMLWriter(&xout);
  cmGeneratedFileStream::~cmGeneratedFileStream(&fout);
  return;
}

Assistant:

void cmCPackIFWInstaller::GenerateInstallerFile()
{
  // Lazy directory initialization
  if (this->Directory.empty() && this->Generator) {
    this->Directory = this->Generator->toplevel;
  }

  // Output stream
  cmGeneratedFileStream fout(this->Directory + "/config/config.xml");
  cmXMLWriter xout(fout);

  xout.StartDocument();

  WriteGeneratedByToStrim(xout);

  xout.StartElement("Installer");

  xout.Element("Name", this->Name);
  xout.Element("Version", this->Version);
  xout.Element("Title", this->Title);

  if (!this->Publisher.empty()) {
    xout.Element("Publisher", this->Publisher);
  }

  if (!this->ProductUrl.empty()) {
    xout.Element("ProductUrl", this->ProductUrl);
  }

  // ApplicationIcon
  if (!this->InstallerApplicationIcon.empty()) {
    std::string name =
      cmSystemTools::GetFilenameName(this->InstallerApplicationIcon);
    std::string path = this->Directory + "/config/" + name;
    name = cmSystemTools::GetFilenameWithoutExtension(name);
    cmsys::SystemTools::CopyFileIfDifferent(this->InstallerApplicationIcon,
                                            path);
    xout.Element("InstallerApplicationIcon", name);
  }

  // WindowIcon
  if (!this->InstallerWindowIcon.empty()) {
    std::string name =
      cmSystemTools::GetFilenameName(this->InstallerWindowIcon);
    std::string path = this->Directory + "/config/" + name;
    cmsys::SystemTools::CopyFileIfDifferent(this->InstallerWindowIcon, path);
    xout.Element("InstallerWindowIcon", name);
  }

  // Logo
  if (!this->Logo.empty()) {
    std::string name = cmSystemTools::GetFilenameName(this->Logo);
    std::string path = this->Directory + "/config/" + name;
    cmsys::SystemTools::CopyFileIfDifferent(this->Logo, path);
    xout.Element("Logo", name);
  }

  // Banner
  if (!this->Banner.empty()) {
    std::string name = cmSystemTools::GetFilenameName(this->Banner);
    std::string path = this->Directory + "/config/" + name;
    cmsys::SystemTools::CopyFileIfDifferent(this->Banner, path);
    xout.Element("Banner", name);
  }

  // Watermark
  if (!this->Watermark.empty()) {
    std::string name = cmSystemTools::GetFilenameName(this->Watermark);
    std::string path = this->Directory + "/config/" + name;
    cmsys::SystemTools::CopyFileIfDifferent(this->Watermark, path);
    xout.Element("Watermark", name);
  }

  // Background
  if (!this->Background.empty()) {
    std::string name = cmSystemTools::GetFilenameName(this->Background);
    std::string path = this->Directory + "/config/" + name;
    cmsys::SystemTools::CopyFileIfDifferent(this->Background, path);
    xout.Element("Background", name);
  }

  // WizardStyle
  if (!this->WizardStyle.empty()) {
    xout.Element("WizardStyle", this->WizardStyle);
  }

  // WizardDefaultWidth
  if (!this->WizardDefaultWidth.empty()) {
    xout.Element("WizardDefaultWidth", this->WizardDefaultWidth);
  }

  // WizardDefaultHeight
  if (!this->WizardDefaultHeight.empty()) {
    xout.Element("WizardDefaultHeight", this->WizardDefaultHeight);
  }

  // TitleColor
  if (!this->TitleColor.empty()) {
    xout.Element("TitleColor", this->TitleColor);
  }

  // Start menu
  if (!this->IsVersionLess("2.0")) {
    xout.Element("StartMenuDir", this->StartMenuDir);
  }

  // Target dir
  if (!this->TargetDir.empty()) {
    xout.Element("TargetDir", this->TargetDir);
  }

  // Admin target dir
  if (!this->AdminTargetDir.empty()) {
    xout.Element("AdminTargetDir", this->AdminTargetDir);
  }

  // Remote repositories
  if (!this->RemoteRepositories.empty()) {
    xout.StartElement("RemoteRepositories");
    for (cmCPackIFWRepository* r : this->RemoteRepositories) {
      r->WriteRepositoryConfig(xout);
    }
    xout.EndElement();
  }

  // Maintenance tool
  if (!this->IsVersionLess("2.0") && !this->MaintenanceToolName.empty()) {
    xout.Element("MaintenanceToolName", this->MaintenanceToolName);
  }

  // Maintenance tool ini file
  if (!this->IsVersionLess("2.0") && !this->MaintenanceToolIniFile.empty()) {
    xout.Element("MaintenanceToolIniFile", this->MaintenanceToolIniFile);
  }

  if (!this->RemoveTargetDir.empty()) {
    xout.Element("RemoveTargetDir", this->RemoveTargetDir);
  }

  // Different allows
  if (this->IsVersionLess("2.0")) {
    // CPack IFW default policy
    xout.Comment("CPack IFW default policy for QtIFW less 2.0");
    xout.Element("AllowNonAsciiCharacters", "true");
    xout.Element("AllowSpaceInPath", "true");
  } else {
    if (!this->AllowNonAsciiCharacters.empty()) {
      xout.Element("AllowNonAsciiCharacters", this->AllowNonAsciiCharacters);
    }
    if (!this->AllowSpaceInPath.empty()) {
      xout.Element("AllowSpaceInPath", this->AllowSpaceInPath);
    }
  }

  // Control script (copy to config dir)
  if (!this->IsVersionLess("2.0") && !this->ControlScript.empty()) {
    std::string name = cmSystemTools::GetFilenameName(this->ControlScript);
    std::string path = this->Directory + "/config/" + name;
    cmsys::SystemTools::CopyFileIfDifferent(this->ControlScript, path);
    xout.Element("ControlScript", name);
  }

  // Resources (copy to resources dir)
  if (!this->Resources.empty()) {
    std::vector<std::string> resources;
    cmCPackIFWResourcesParser parser(this);
    for (size_t i = 0; i < this->Resources.size(); i++) {
      if (parser.ParseResource(i)) {
        std::string name = cmSystemTools::GetFilenameName(this->Resources[i]);
        std::string path = this->Directory + "/resources/" + name;
        cmsys::SystemTools::CopyFileIfDifferent(this->Resources[i], path);
        resources.push_back(std::move(name));
      } else {
        cmCPackIFWLogger(WARNING,
                         "Can't copy resources from \""
                           << this->Resources[i]
                           << "\". Resource will be skipped." << std::endl);
      }
    }
    this->Resources = resources;
  }

  xout.EndElement();
  xout.EndDocument();
}